

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O2

int store_attrs(ly_ctx *ctx,attr_cont *attrs,lyd_node *first,int options)

{
  int iVar1;
  lyd_attr *plVar2;
  lyd_node *parent;
  attr_cont *paVar3;
  uint uVar4;
  
  uVar4 = 0;
LAB_0013b4ef:
  if (attrs == (attr_cont *)0x0) {
    return 0;
  }
  paVar3 = attrs->next;
  parent = first;
  if (attrs->index != 0) {
    uVar4 = 1;
  }
  do {
    if (parent == (lyd_node *)0x0) {
      ly_vlog(LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"element for the specified attribute",
              attrs->attr->name);
      lyd_free_attr(attrs->schema->module->ctx,(lyd_node *)0x0,attrs->attr,1);
      goto LAB_0013b5fa;
    }
    if (attrs->schema == parent->schema) {
      if ((uVar4 == 0) || (uVar4 == attrs->index)) break;
      uVar4 = uVar4 + 1;
    }
    parent = parent->next;
  } while( true );
  if (parent->attr != (lyd_attr *)0x0) {
    ly_vlog(LYE_XML_INVAL,LY_VLOG_LYD,parent,
            "attribute (multiple attribute definitions belong to a single element)");
    goto LAB_0013b5fa;
  }
  plVar2 = attrs->attr;
  parent->attr = plVar2;
  for (; plVar2 != (lyd_attr *)0x0; plVar2 = plVar2->next) {
    plVar2->parent = parent;
  }
  free(attrs);
  attrs = paVar3;
  if (((options & 8U) != 0) &&
     (iVar1 = lyp_check_edit_attr(ctx,parent->attr,parent,(int *)0x0), iVar1 != 0)) {
    while (attrs != (attr_cont *)0x0) {
      paVar3 = attrs->next;
      lyd_free_attr(ctx,(lyd_node *)0x0,attrs->attr,1);
LAB_0013b5fa:
      free(attrs);
      attrs = paVar3;
    }
    return -1;
  }
  goto LAB_0013b4ef;
}

Assistant:

static int
store_attrs(struct ly_ctx *ctx, struct attr_cont *attrs, struct lyd_node *first, int options)
{
    struct lyd_node *diter;
    struct attr_cont *iter;
    struct lyd_attr *aiter;
    unsigned int flag_leaflist = 0;

    while (attrs) {
        iter = attrs;
        attrs = attrs->next;

        if (iter->index) {
            flag_leaflist = 1;
        }

        LY_TREE_FOR(first, diter) {
            if (iter->schema != diter->schema) {
                continue;
            }

            if (flag_leaflist && flag_leaflist != iter->index) {
                flag_leaflist++;
                continue;
            }

            /* we have match */
            if (diter->attr) {
                LOGVAL(LYE_XML_INVAL, LY_VLOG_LYD, diter,
                       "attribute (multiple attribute definitions belong to a single element)");
                free(iter);
                goto error;
            }

            diter->attr = iter->attr;
            for (aiter = iter->attr; aiter; aiter = aiter->next) {
                aiter->parent = diter;
            }

            break;
        }

        if (!diter) {
            LOGVAL(LYE_XML_MISS, LY_VLOG_NONE, NULL, "element for the specified attribute", iter->attr->name);
            lyd_free_attr(iter->schema->module->ctx, NULL, iter->attr, 1);
            free(iter);
            goto error;
        }
        free(iter);

        /* check edit-config attribute correctness */
        if ((options & LYD_OPT_EDIT) && lyp_check_edit_attr(ctx, diter->attr, diter, NULL)) {
            goto error;
        }
    }

    return 0;

error:

    while (attrs) {
        iter = attrs;
        attrs = attrs->next;

        lyd_free_attr(ctx, NULL, iter->attr, 1);
        free(iter);
    }

    return -1;
}